

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall cmExtraEclipseCDT4Generator::Generate(cmExtraEclipseCDT4Generator *this)

{
  bool bVar1;
  int iVar2;
  LocalGeneratorVector *this_00;
  const_reference this_01;
  pointer pcVar3;
  cmMakefile *this_02;
  string *psVar4;
  undefined8 uVar5;
  bool local_40a;
  bool local_3f2;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  byte local_353;
  byte local_352;
  allocator<char> local_351;
  string local_350;
  byte local_32b;
  byte local_32a;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  int local_2dc;
  undefined1 local_2d8 [4];
  int version;
  int local_2b4;
  int local_2b0;
  int res;
  uint minorVersion;
  uint majorVersion;
  RegularExpression regex;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string eclipseVersion;
  cmMakefile *mf;
  value_type *lg;
  cmExtraEclipseCDT4Generator *this_local;
  
  this_00 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  this_01 = std::
            vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ::operator[](this_00,0);
  pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                     (this_01);
  this_02 = cmLocalGenerator::GetMakefile(pcVar3);
  eclipseVersion.field_2._8_8_ = this_02;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_ECLIPSE_VERSION",&local_61);
  psVar4 = cmMakefile::GetSafeDefinition(this_02,&local_60);
  std::__cxx11::string::string((string *)local_40,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&minorVersion,".*([0-9]+\\.[0-9]+).*");
  bVar1 = cmsys::RegularExpression::find((RegularExpression *)&minorVersion,(string *)local_40);
  if (bVar1) {
    res = 0;
    local_2b0 = 0;
    cmsys::RegularExpression::match_abi_cxx11_
              ((string *)local_2d8,(RegularExpression *)&minorVersion,1);
    uVar5 = std::__cxx11::string::c_str();
    iVar2 = __isoc99_sscanf(uVar5,"%u.%u",&res,&local_2b0);
    std::__cxx11::string::~string((string *)local_2d8);
    local_2b4 = iVar2;
    if (iVar2 == 2) {
      local_2dc = res * 1000 + local_2b0;
      if (local_2dc < 0xbbe) {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
      }
      if (local_2dc < 0xbbf) {
        this->SupportsGmakeErrorParser = false;
      }
    }
  }
  pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                     (this_01);
  psVar4 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(pcVar3);
  std::__cxx11::string::operator=((string *)&this->HomeDirectory,(string *)psVar4);
  pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                     (this_01);
  psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(pcVar3);
  std::__cxx11::string::operator=((string *)&this->HomeOutputDirectory,(string *)psVar4);
  uVar5 = eclipseVersion.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES",&local_301);
  bVar1 = cmMakefile::IsOn((cmMakefile *)uVar5,&local_300);
  this->GenerateLinkedResources = bVar1;
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  bVar1 = std::operator!=(&this->HomeDirectory,&this->HomeOutputDirectory);
  uVar5 = eclipseVersion.field_2._8_8_;
  this->IsOutOfSourceBuild = bVar1;
  local_32a = 0;
  local_32b = 0;
  local_3f2 = false;
  if ((this->IsOutOfSourceBuild & 1U) != 0) {
    std::allocator<char>::allocator();
    local_32a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT",&local_329);
    local_32b = 1;
    local_3f2 = cmMakefile::IsOn((cmMakefile *)uVar5,&local_328);
  }
  this->GenerateSourceProject = local_3f2;
  if ((local_32b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_328);
  }
  if ((local_32a & 1) != 0) {
    std::allocator<char>::~allocator(&local_329);
  }
  uVar5 = eclipseVersion.field_2._8_8_;
  local_352 = 0;
  local_353 = 0;
  local_40a = false;
  if ((this->GenerateSourceProject & 1U) == 0) {
    std::allocator<char>::allocator();
    local_352 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT",&local_351);
    local_353 = 1;
    local_40a = cmMakefile::IsOn((cmMakefile *)uVar5,&local_350);
  }
  if ((local_353 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_350);
  }
  if ((local_352 & 1) != 0) {
    std::allocator<char>::~allocator(&local_351);
  }
  uVar5 = eclipseVersion.field_2._8_8_;
  if (local_40a != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,
               "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, but this variable is not supported anymore since CMake 2.8.7.\nEnable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead."
               ,&local_379);
    cmMakefile::IssueMessage((cmMakefile *)uVar5,WARNING,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator(&local_379);
  }
  bVar1 = cmsys::SystemTools::IsSubDirectory(&this->HomeOutputDirectory,&this->HomeDirectory);
  uVar5 = eclipseVersion.field_2._8_8_;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,
               "The build directory is a subdirectory of the source directory.\nThis is not supported well by Eclipse. It is strongly recommended to use a build directory which is a sibling of the source directory."
               ,&local_3a1);
    cmMakefile::IssueMessage((cmMakefile *)uVar5,WARNING,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator(&local_3a1);
  }
  if ((this->GenerateSourceProject & 1U) != 0) {
    CreateSourceProjectFile(this);
  }
  CreateProjectFile(this);
  CreateCProjectFile(this);
  CreateSettingsResourcePrefsFile(this);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&minorVersion);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::Generate()
{
  const auto& lg = this->GlobalGenerator->GetLocalGenerators()[0];
  const cmMakefile* mf = lg->GetMakefile();

  std::string eclipseVersion = mf->GetSafeDefinition("CMAKE_ECLIPSE_VERSION");
  cmsys::RegularExpression regex(".*([0-9]+\\.[0-9]+).*");
  if (regex.find(eclipseVersion)) {
    unsigned int majorVersion = 0;
    unsigned int minorVersion = 0;
    int res =
      sscanf(regex.match(1).c_str(), "%u.%u", &majorVersion, &minorVersion);
    if (res == 2) {
      int version = majorVersion * 1000 + minorVersion;
      if (version < 3006) // 3.6 is Helios
      {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
      }
      if (version < 3007) // 3.7 is Indigo
      {
        this->SupportsGmakeErrorParser = false;
      }
    }
  }

  // TODO: Decide if these are local or member variables
  this->HomeDirectory = lg->GetSourceDirectory();
  this->HomeOutputDirectory = lg->GetBinaryDirectory();

  this->GenerateLinkedResources =
    mf->IsOn("CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES");

  this->IsOutOfSourceBuild =
    (this->HomeDirectory != this->HomeOutputDirectory);

  this->GenerateSourceProject =
    (this->IsOutOfSourceBuild &&
     mf->IsOn("CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT"));

  if (!this->GenerateSourceProject &&
      (mf->IsOn("ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT"))) {
    mf->IssueMessage(
      MessageType::WARNING,
      "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, "
      "but this variable is not supported anymore since CMake 2.8.7.\n"
      "Enable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead.");
  }

  if (cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                    this->HomeDirectory)) {
    mf->IssueMessage(MessageType::WARNING,
                     "The build directory is a subdirectory "
                     "of the source directory.\n"
                     "This is not supported well by Eclipse. It is strongly "
                     "recommended to use a build directory which is a "
                     "sibling of the source directory.");
  }

  // NOTE: This is not good, since it pollutes the source tree. However,
  //       Eclipse doesn't allow CVS/SVN to work when the .project is not in
  //       the cvs/svn root directory. Hence, this is provided as an option.
  if (this->GenerateSourceProject) {
    // create .project file in the source tree
    this->CreateSourceProjectFile();
  }

  // create a .project file
  this->CreateProjectFile();

  // create a .cproject file
  this->CreateCProjectFile();

  // create resource settings
  this->CreateSettingsResourcePrefsFile();
}